

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_listener.c
# Opt level: O3

apx_fileEventListener2_t * apx_fileEventListener_clone(apx_fileEventListener2_t *other)

{
  apx_fileEventListener2_t *paVar1;
  
  if (other != (apx_fileEventListener2_t *)0x0) {
    paVar1 = (apx_fileEventListener2_t *)malloc(8);
    if (paVar1 == (apx_fileEventListener2_t *)0x0) {
      paVar1 = (apx_fileEventListener2_t *)0x0;
    }
    else {
      paVar1->remoteFileWrite1 = other->remoteFileWrite1;
    }
    return paVar1;
  }
  return (apx_fileEventListener2_t *)0x0;
}

Assistant:

apx_fileEventListener2_t *apx_fileEventListener_clone(apx_fileEventListener2_t *other)
{
   if (other != 0)
   {
      apx_fileEventListener2_t *self = (apx_fileEventListener2_t*) malloc(sizeof(apx_fileEventListener2_t));
      if (self != 0)
      {
         *self = *other;
      }
      return self;
   }
   return (apx_fileEventListener2_t*) 0;
}